

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O2

long src_callback_read(SRC_STATE *state,double src_ratio,long frames,float *data)

{
  SRC_ERROR SVar1;
  long lVar2;
  float *ptr;
  float dummy [1];
  float *local_80;
  float local_74;
  SRC_DATA local_70;
  
  if (0 < frames && state != (SRC_STATE *)0x0) {
    if (state->mode == SRC_MODE_CALLBACK) {
      if (state->callback_func == (src_callback_t)0x0) {
        state->error = SRC_ERR_NULL_CALLBACK;
      }
      else {
        local_70.end_of_input = 0;
        local_70._52_4_ = 0;
        local_70.input_frames_used = 0;
        local_70.output_frames_gen = 0;
        if ((0.00390625 <= src_ratio) && (src_ratio <= 256.0)) {
          local_70.data_in = state->saved_data;
          local_70.input_frames = state->saved_frames;
          lVar2 = 0;
          local_70.data_out = data;
          local_70.output_frames = frames;
          local_70.src_ratio = src_ratio;
          do {
            if (frames <= lVar2) break;
            if (local_70.input_frames == 0) {
              local_80 = &local_74;
              local_70.input_frames = (*state->callback_func)(state->user_callback_data,&local_80);
              local_70.data_in = local_80;
              if (local_70.input_frames == 0) {
                local_70.end_of_input = 1;
              }
            }
            state->mode = SRC_MODE_PROCESS;
            SVar1 = src_process(state,&local_70);
            state->mode = SRC_MODE_CALLBACK;
            if (SVar1 != SRC_ERR_NO_ERROR) {
              state->saved_data = local_70.data_in;
              state->saved_frames = local_70.input_frames;
              state->error = SVar1;
              return 0;
            }
            local_70.input_frames = local_70.input_frames - local_70.input_frames_used;
            local_70.data_in = local_70.data_in + local_70.input_frames_used * state->channels;
            local_70.data_out = local_70.data_out + state->channels * local_70.output_frames_gen;
            local_70.output_frames = local_70.output_frames - local_70.output_frames_gen;
            lVar2 = lVar2 + local_70.output_frames_gen;
          } while (local_70.output_frames_gen != 0 || local_70.end_of_input != 1);
          state->saved_data = local_70.data_in;
          state->saved_frames = local_70.input_frames;
          return lVar2;
        }
        state->error = SRC_ERR_BAD_SRC_RATIO;
      }
    }
    else {
      state->error = SRC_ERR_BAD_MODE;
    }
  }
  return 0;
}

Assistant:

long
src_callback_read (SRC_STATE *state, double src_ratio, long frames, float *data)
{
	SRC_DATA	src_data ;

	long	output_frames_gen ;
	int		error = 0 ;

	if (state == NULL)
		return 0 ;

	if (frames <= 0)
		return 0 ;

	if (state->mode != SRC_MODE_CALLBACK)
	{	state->error = SRC_ERR_BAD_MODE ;
		return 0 ;
		} ;

	if (state->callback_func == NULL)
	{	state->error = SRC_ERR_NULL_CALLBACK ;
		return 0 ;
		} ;

	memset (&src_data, 0, sizeof (src_data)) ;

	/* Check src_ratio is in range. */
	if (is_bad_src_ratio (src_ratio))
	{	state->error = SRC_ERR_BAD_SRC_RATIO ;
		return 0 ;
		} ;

	/* Switch modes temporarily. */
	src_data.src_ratio = src_ratio ;
	src_data.data_out = data ;
	src_data.output_frames = frames ;

	src_data.data_in = state->saved_data ;
	src_data.input_frames = state->saved_frames ;

	output_frames_gen = 0 ;
	while (output_frames_gen < frames)
	{	/*	Use a dummy array for the case where the callback function
		**	returns without setting the ptr.
		*/
		float dummy [1] ;

		if (src_data.input_frames == 0)
		{	float *ptr = dummy ;

			src_data.input_frames = state->callback_func (state->user_callback_data, &ptr) ;
			src_data.data_in = ptr ;

			if (src_data.input_frames == 0)
				src_data.end_of_input = 1 ;
			} ;

		/*
		** Now call process function. However, we need to set the mode
		** to SRC_MODE_PROCESS first and when we return set it back to
		** SRC_MODE_CALLBACK.
		*/
		state->mode = SRC_MODE_PROCESS ;
		error = src_process (state, &src_data) ;
		state->mode = SRC_MODE_CALLBACK ;

		if (error != 0)
			break ;

		src_data.data_in += src_data.input_frames_used * state->channels ;
		src_data.input_frames -= src_data.input_frames_used ;

		src_data.data_out += src_data.output_frames_gen * state->channels ;
		src_data.output_frames -= src_data.output_frames_gen ;

		output_frames_gen += src_data.output_frames_gen ;

		if (src_data.end_of_input == SRC_TRUE && src_data.output_frames_gen == 0)
			break ;
		} ;

	state->saved_data = src_data.data_in ;
	state->saved_frames = src_data.input_frames ;

	if (error != 0)
	{	state->error = (SRC_ERROR) error ;
		return 0 ;
		} ;

	return output_frames_gen ;
}